

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * __thiscall
(anonymous_namespace)::AtomicBaseline<(std::memory_order)3>::GetName_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"Atomic Baseline (","");
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]]
  std::string GetName() const noexcept override {
    std::string name = "Atomic Baseline (";
    name.append(GetMemoryOrderRepr(Order));
    name.append(")");
    return name;
  }